

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> * __thiscall
kj::_::ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
operator=(ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this,
         ExceptionOr<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
         *param_1)

{
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
                (&(this->value).ptr.field_1.value);
    }
    if ((param_1->value).ptr.isSet == true) {
      OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::moveFrom
                (&(this->value).ptr.field_1.value,&(param_1->value).ptr.field_1.value);
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::destroy
              (&(param_1->value).ptr.field_1.value);
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;